

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_getuservalue(lua_State *L,int idx)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  int iVar3;
  TValue *pTVar4;
  Udata *iu;
  TValue *io;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3bd,"int lua_getuservalue(lua_State *, int)");
  }
  pTVar4 = index2addr(L,idx);
  if (pTVar4->tt_ != 0x8007) {
    __assert_fail("(((((o))->tt_) == (((7) | (1 << 15))))) && \"full userdata expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3bf,"int lua_getuservalue(lua_State *, int)");
  }
  pTVar1 = L->top;
  if (pTVar4->tt_ != 0x8007) {
    __assert_fail("((((o))->tt_) == (((7) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3c0,"int lua_getuservalue(lua_State *, int)");
  }
  if (((pTVar4->value_).gc)->tt != '\a') {
    __assert_fail("(((o)->value_).gc)->tt == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3c0,"int lua_getuservalue(lua_State *, int)");
  }
  p_Var2 = (pTVar4->value_).f;
  pTVar1->value_ = *(Value *)(p_Var2 + 0x20);
  pTVar1->tt_ = *(LuaType *)(p_Var2 + 10);
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3c0,"int lua_getuservalue(lua_State *, int)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0012bcdb:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3c0,"int lua_getuservalue(lua_State *, int)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3c0,"int lua_getuservalue(lua_State *, int)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0012bcdb;
    }
  }
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3c1,"int lua_getuservalue(lua_State *, int)");
  }
  iVar3 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar3;
  if (iVar3 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3c2,"int lua_getuservalue(lua_State *, int)");
  }
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_getuservalue (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  o = index2addr(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  getuservalue(L, uvalue(o), L->top);
  api_incr_top(L);
  lua_unlock(L);
  return ttnov(L->top - 1);
}